

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void testing::internal::InitGoogleMockImpl<char>(int *argc,char **argv)

{
  int iVar1;
  char *str;
  bool bVar2;
  String *value;
  int iVar3;
  char **streamable;
  long lVar4;
  String SVar5;
  String arg_string;
  char *local_40 [2];
  
  InitGoogleTestImpl<char>(argc,argv);
  if (1 < *argc) {
    iVar3 = 1;
    do {
      streamable = argv + iVar3;
      SVar5 = StreamableToString<char*>((internal *)local_40,streamable);
      str = local_40[0];
      bVar2 = ParseGoogleMockBoolFlag(local_40[0],(char *)streamable,(bool *)SVar5.length_);
      if (bVar2) {
LAB_00159729:
        iVar1 = *argc;
        if (iVar1 != iVar3) {
          lVar4 = 0;
          do {
            argv[iVar3 + lVar4] = argv[(long)iVar3 + lVar4 + 1];
            lVar4 = lVar4 + 1;
          } while (iVar1 - iVar3 != (int)lVar4);
        }
        *argc = iVar1 + -1;
        iVar3 = iVar3 + -1;
      }
      else {
        bVar2 = ParseGoogleMockStringFlag(str,(char *)streamable,value);
        if (bVar2) goto LAB_00159729;
      }
      if (local_40[0] != (char *)0x0) {
        operator_delete__(local_40[0]);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != *argc);
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const String arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    if (ParseGoogleMockBoolFlag(arg, "catch_leaked_mocks",
                                &GMOCK_FLAG(catch_leaked_mocks)) ||
        ParseGoogleMockStringFlag(arg, "verbose", &GMOCK_FLAG(verbose))) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}